

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathQuat.h
# Opt level: O2

Quat<float> * __thiscall Imath_3_2::Quat<float>::operator*=(Quat<float> *this,Quat<float> *q)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  float fVar11;
  undefined8 local_30;
  float local_28;
  
  fVar1 = this->r;
  fVar2 = q->r;
  fVar11 = Vec3<float>::dot(&this->v,&q->v);
  fVar3 = this->r;
  fVar4 = (q->v).z;
  fVar5 = q->r;
  fVar6 = (this->v).z;
  uVar7 = (q->v).x;
  uVar9 = (q->v).y;
  uVar8 = (this->v).x;
  uVar10 = (this->v).y;
  Vec3<float>::operator%(&this->v,&q->v);
  (this->v).x = (float)local_30 + fVar5 * (float)uVar8 + fVar3 * (float)uVar7;
  (this->v).y = (float)((ulong)local_30 >> 0x20) + fVar5 * (float)uVar10 + fVar3 * (float)uVar9;
  (this->v).z = fVar6 * fVar5 + fVar4 * fVar3 + local_28;
  this->r = fVar1 * fVar2 - fVar11;
  return this;
}

Assistant:

const Quat<T>&
Quat<T>::operator*= (const Quat<T>& q) IMATH_NOEXCEPT
{
    T rtmp = r * q.r - (v ^ q.v);
    v      = r * q.v + v * q.r + v % q.v;
    r      = rtmp;
    return *this;
}